

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(TreeEnsembleParameters *a,TreeEnsembleParameters *b)

{
  bool bVar1;
  RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode> *a_00;
  RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode> *b_00;
  uint64 uVar2;
  uint64 uVar3;
  RepeatedField<double> *a_01;
  RepeatedField<double> *b_01;
  TreeEnsembleParameters *b_local;
  TreeEnsembleParameters *a_local;
  
  a_00 = TreeEnsembleParameters::nodes(a);
  b_00 = TreeEnsembleParameters::nodes(b);
  bVar1 = operator!=(a_00,b_00);
  if (bVar1) {
    a_local._7_1_ = false;
  }
  else {
    uVar2 = TreeEnsembleParameters::numpredictiondimensions(a);
    uVar3 = TreeEnsembleParameters::numpredictiondimensions(b);
    if (uVar2 == uVar3) {
      a_01 = TreeEnsembleParameters::basepredictionvalue(a);
      b_01 = TreeEnsembleParameters::basepredictionvalue(b);
      bVar1 = operator!=(a_01,b_01);
      if (bVar1) {
        a_local._7_1_ = false;
      }
      else {
        a_local._7_1_ = true;
      }
    }
    else {
      a_local._7_1_ = false;
    }
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const TreeEnsembleParameters& a,
                        const TreeEnsembleParameters& b) {
            if (a.nodes() != b.nodes()) {
                return false;
            }
            if (a.numpredictiondimensions() != b.numpredictiondimensions()) {
                return false;
            }
            if (a.basepredictionvalue() != b.basepredictionvalue()) {
                return false;
            }
            return true;
        }